

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic.c
# Opt level: O0

int testEqual(BDD a,BDD b)

{
  BDD b_local;
  BDD a_local;
  
  if (a == b) {
    a_local._4_4_ = 1;
  }
  else if (a == 0xffffffffffffffff) {
    fprintf(_stderr,"a is invalid!\n");
    a_local._4_4_ = 0;
  }
  else if (b == 0xffffffffffffffff) {
    fprintf(_stderr,"b is invalid!\n");
    a_local._4_4_ = 0;
  }
  else {
    fprintf(_stderr,"a and b are not equal!\n");
    sylvan_fprint((FILE *)_stderr,a);
    fprintf(_stderr,"\n");
    sylvan_fprint((FILE *)_stderr,b);
    fprintf(_stderr,"\n");
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

int testEqual(BDD a, BDD b)
{
    if (a == b) return 1;

    if (a == sylvan_invalid) {
        fprintf(stderr, "a is invalid!\n");
        return 0;
    }

    if (b == sylvan_invalid) {
        fprintf(stderr, "b is invalid!\n");
        return 0;
    }

    fprintf(stderr, "a and b are not equal!\n");

    sylvan_fprint(stderr, a);fprintf(stderr, "\n");
    sylvan_fprint(stderr, b);fprintf(stderr, "\n");

    return 0;
}